

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment.cpp
# Opt level: O0

clock_t experiment::forwardExperiment(uint cashSize)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  clock_t cVar5;
  clock_t cVar6;
  uint local_38;
  uint local_34;
  uint j;
  uint i_1;
  int newA;
  uint i;
  int *a;
  clock_t finish;
  clock_t start;
  uint cashSize_local;
  
  auVar1 = ZEXT416(cashSize << 8) * ZEXT816(4);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  puVar4 = (uint *)operator_new__(uVar3);
  for (i_1 = 0; i_1 < cashSize << 8; i_1 = i_1 + 1) {
    uVar2 = rand();
    puVar4[i_1] = uVar2;
  }
  j = 0;
  cVar5 = clock();
  for (local_34 = 0; local_34 < 1000; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < cashSize << 8; local_38 = local_38 + 1) {
      j = puVar4[local_38];
    }
  }
  cVar6 = clock();
  *puVar4 = j;
  if (puVar4 != (uint *)0x0) {
    operator_delete__(puVar4);
  }
  return cVar6 - cVar5;
}

Assistant:

clock_t experiment::forwardExperiment(unsigned int cashSize)
{
    clock_t start, finish;
    int *a = new int[cashSize * 256];
    for(unsigned int i = 0; i < cashSize * 256; ++i)
    {
        a[i] = rand();
    }
    int newA=0;
    start = clock();
    for(unsigned int i = 0; i < 1000; ++i)
    {
       for(unsigned int j = 0; j < cashSize * 256; ++j)
       {
           newA = a[j];
       }
    }
    finish = clock();
    a[0]=newA;
    delete[]a;
    return finish - start;
}